

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O0

REF_STATUS ref_subdiv_mark_prism_sides(REF_SUBDIV ref_subdiv)

{
  REF_CELL pRVar1;
  uint uVar2;
  int iStack_40;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT pri_side_cell_edge [3];
  REF_INT pri_side_edge;
  REF_INT node1;
  REF_INT node0;
  REF_INT cell_edge;
  REF_INT cell;
  REF_CELL ref_cell;
  REF_SUBDIV ref_subdiv_local;
  
  pRVar1 = ref_subdiv->grid->cell[10];
  _iStack_40 = 0x400000002;
  pri_side_cell_edge[0] = 5;
  node0 = 0;
  do {
    if (pRVar1->max <= node0) {
      return 0;
    }
    if (((-1 < node0) && (node0 < pRVar1->max)) && (pRVar1->c2n[pRVar1->size_per * node0] != -1)) {
      for (pri_side_cell_edge[1] = 0; pri_side_cell_edge[1] < 3;
          pri_side_cell_edge[1] = pri_side_cell_edge[1] + 1) {
        pri_side_cell_edge[2] =
             pRVar1->c2n
             [pRVar1->e2n[(&iStack_40)[pri_side_cell_edge[1]] * 2 + 1] + pRVar1->size_per * node0];
        uVar2 = ref_subdiv_mark_to_split
                          (ref_subdiv,
                           pRVar1->c2n
                           [pRVar1->e2n[(&iStack_40)[pri_side_cell_edge[1]] << 1] +
                            pRVar1->size_per * node0],pri_side_cell_edge[2]);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x121,"ref_subdiv_mark_prism_sides",(ulong)uVar2,"sd");
          return uVar2;
        }
      }
    }
    node0 = node0 + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_subdiv_mark_prism_sides(REF_SUBDIV ref_subdiv) {
  REF_CELL ref_cell = ref_grid_pri(ref_subdiv_grid(ref_subdiv));
  REF_INT cell, cell_edge;
  REF_INT node0, node1;

  REF_INT pri_side_edge;
  REF_INT pri_side_cell_edge[] = {2, 4, 5};

  each_ref_cell_valid_cell(ref_cell, cell) {
    for (pri_side_edge = 0; pri_side_edge < 3; pri_side_edge++) {
      cell_edge = pri_side_cell_edge[pri_side_edge];
      node0 = ref_cell_e2n(ref_cell, 0, cell_edge, cell);
      node1 = ref_cell_e2n(ref_cell, 1, cell_edge, cell);
      RSS(ref_subdiv_mark_to_split(ref_subdiv, node0, node1), "sd");
    }
  }

  return REF_SUCCESS;
}